

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall astarTest_methodTesting_Test::TestBody(astarTest_methodTesting_Test *this)

{
  pointer pvVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  undefined1 auVar3 [8];
  pointer ppVar4;
  bool bVar5;
  pointer piVar6;
  char *pcVar7;
  undefined1 local_1a0 [8];
  astar a;
  astar a1;
  astar astar2;
  astar astar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_148;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_130;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_118;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_100;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_e8;
  undefined1 local_d0 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> path1;
  undefined1 auStack_98 [8];
  AssertionResult gtest_ar_3;
  undefined1 auStack_78 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> path2;
  bool local_52;
  bool local_51;
  bool status1;
  bool status;
  undefined1 auStack_48 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m;
  Message local_28;
  map local_1a;
  map local_19 [7];
  map map2;
  map map1;
  
  astar::astar((astar *)local_1a0);
  auStack_78 = (undefined1  [8])((ulong)(uint)auStack_78._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_d0,"a.x_start_","0",(int *)local_1a0,(int *)auStack_78);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_78);
    if (m1.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      piVar6 = (pointer)0x142c23;
    }
    else {
      piVar6 = ((m1.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
               ,0x49,(char *)piVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_48,(Message *)auStack_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_48);
    if (auStack_78 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (auStack_78 != (undefined1  [8])0x0)) {
        (**(code **)((long)*(pair<int,_int> *)auStack_78 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    astar::astar((astar *)&a.x_goal_,0,0,5,5);
    auStack_78._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d0,"a1.x_goal_","5",&a1.x_start_,(int *)auStack_78);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)auStack_78);
      if (m1.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        piVar6 = (pointer)0x142c23;
      }
      else {
        piVar6 = ((m1.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)auStack_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                 ,0x4c,(char *)piVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)auStack_48,(Message *)auStack_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_48);
      if (auStack_78 != (undefined1  [8])0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) && (auStack_78 != (undefined1  [8])0x0)) {
          (**(code **)((long)*(pair<int,_int> *)auStack_78 + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      astar::astar((astar *)&a1.x_goal_,0,0,2,2);
      map::create_map((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)local_d0,&local_1a);
      auStack_78 = (undefined1  [8])0x0;
      path2.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      path2.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&astar1.x_goal_,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_d0);
      astar::astar_path((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        auStack_48,(astar *)&a1.x_goal_,
                        (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&astar1.x_goal_);
      ppVar4 = path2.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      auVar3 = auStack_78;
      auStack_78 = auStack_48;
      path2.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)m.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      path2.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)m.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      auStack_48 = (undefined1  [8])0x0;
      m.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      m.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (auVar3 != (undefined1  [8])0x0) {
        operator_delete((void *)auVar3,(long)ppVar4 - (long)auVar3);
        if (auStack_48 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_48,
                          (long)m.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
        }
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&astar1.x_goal_);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_148,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_d0);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                (&local_100,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)auStack_78);
      bVar5 = map::print_path(&local_1a,&local_148,&local_100);
      if (local_100.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_148);
      m1.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(m1.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
      local_52 = bVar5;
      testing::internal::CmpHelperEQ<bool,int>
                ((internal *)auStack_48,"status1","1",&local_52,
                 (int *)&m1.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (auStack_48[0] == (internal)0x0) {
        testing::Message::Message
                  ((Message *)
                   &m1.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (m.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          piVar6 = (pointer)0x142c23;
        }
        else {
          piVar6 = ((m.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                   _M_start;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)auStack_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                   ,0x54,(char *)piVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)auStack_98,
                   (Message *)
                   &m1.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_98);
        if (m1.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             (m1.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
            (**(code **)(((m1.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 2))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        astar::astar((astar *)&astar2.x_goal_,0,0,5,5);
        map::create_map((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)auStack_48,local_19);
        pcVar7 = ((AssertHelperData *)((long)auStack_48 + 0x70))->file;
        pcVar7[0x14] = '\0';
        pcVar7[0x15] = '\0';
        pcVar7[0x16] = '\0';
        pcVar7[0x17] = '\0';
        m1.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector(&local_130,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)auStack_48);
        astar::astar_path((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          auStack_98,(astar *)&astar2.x_goal_,&local_130);
        sVar2 = gtest_ar_3.message_;
        pvVar1 = m1.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        m1.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_98;
        auStack_98 = (undefined1  [8])0x0;
        gtest_ar_3.success_ = false;
        gtest_ar_3._1_7_ = 0;
        gtest_ar_3.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (pvVar1 != (pointer)0x0) {
          operator_delete(pvVar1,-(long)pvVar1);
          if (auStack_98 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_98,(long)gtest_ar_3.message_.ptr_ - (long)auStack_98);
          }
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_130);
        local_28.ss_.ptr_._0_4_ = 0xffffffff;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)auStack_98,"path1[0].first","-1",
                   (int *)m1.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(int *)&local_28);
        if (auStack_98[0] == (internal)0x0) {
          testing::Message::Message(&local_28);
          if (gtest_ar_3._0_8_ == 0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar_3._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffb0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                     ,0x5c,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffb0,&local_28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
          if (CONCAT44(local_28.ss_.ptr_._4_4_,(uint)local_28.ss_.ptr_) != 0) {
            bVar5 = testing::internal::IsTrue(true);
            if ((bVar5) &&
               ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,(uint)local_28.ss_.ptr_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,(uint)local_28.ss_.ptr_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::vector(&local_118,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)auStack_48);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                    (&local_e8,
                     (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &m1.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar5 = map::print_path(local_19,&local_118,&local_e8);
          if (local_e8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_e8.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_e8.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_118);
          local_28.ss_.ptr_._0_4_ = (uint)local_28.ss_.ptr_ & 0xffffff00;
          local_51 = bVar5;
          testing::internal::CmpHelperEQ<bool,bool>
                    ((internal *)auStack_98,"status","false",&local_51,(bool *)&local_28);
          if (auStack_98[0] == (internal)0x0) {
            testing::Message::Message(&local_28);
            if (gtest_ar_3._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar_3._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffffb0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                       ,0x5f,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffffb0,&local_28);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0)
            ;
            if (CONCAT44(local_28.ss_.ptr_._4_4_,(uint)local_28.ss_.ptr_) != 0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) &&
                 ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,(uint)local_28.ss_.ptr_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,(uint)local_28.ss_.ptr_) + 8)
                )();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        if (m1.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(m1.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)sVar2.ptr_ -
                          (long)m1.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)auStack_48);
      }
      if (auStack_78 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_78,
                        (long)path2.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_d0);
    }
  }
  return;
}

Assistant:

TEST(astarTest, methodTesting) {
  astar a;

  ASSERT_EQ(a.x_start_, 0);

  astar a1(0, 0, 5, 5);
  ASSERT_EQ(a1.x_goal_, 5);

  astar astar2(0, 0, 2, 2);
  map map2;
  std::vector<std::vector<int>> m1 = map2.create_map();
  std::vector<std::pair<int, int>> path2;
  path2 = astar2.astar_path(m1);
  bool status1 = map2.print_path(m1, path2);
  ASSERT_EQ(status1, 1);

  astar astar1(0, 0, 5, 5);
  map map1;
  std::vector<std::vector<int>> m = map1.create_map();
  m[5][5] = 0;
  std::vector<std::pair<int, int>> path1;
  path1 = astar1.astar_path(m);
  ASSERT_EQ(path1[0].first, -1);

  bool status = map1.print_path(m, path1);
  ASSERT_EQ(status, false);
}